

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O2

void __thiscall duckdb::MetadataWriter::Flush(MetadataWriter *this)

{
  data_ptr_t __s;
  
  if (this->offset < this->capacity) {
    __s = Ptr(this);
    switchD_004a0b15::default(__s,0,this->capacity - this->offset);
  }
  BufferHandle::Destroy(&(this->block).handle);
  return;
}

Assistant:

void MetadataWriter::Flush() {
	if (offset < capacity) {
		// clear remaining bytes of block (if any)
		memset(Ptr(), 0, capacity - offset);
	}
	block.handle.Destroy();
}